

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr term_init(term *t,wchar_t w,wchar_t h,wchar_t k)

{
  int *piVar1;
  ui_event *puVar2;
  int *piVar3;
  term_win *ptVar4;
  ulong uVar5;
  
  memset(t,0,0xd8);
  t->key_size = (uint16_t)k;
  puVar2 = (ui_event *)mem_zalloc((ulong)(uint)((k & 0xffffU) * 0xc));
  t->key_queue = puVar2;
  t->wid = w;
  t->hgt = h;
  piVar3 = (int *)mem_zalloc((long)h * 4);
  t->x1 = piVar3;
  piVar3 = (int *)mem_zalloc((long)h * 4);
  t->x2 = piVar3;
  ptVar4 = (term_win *)mem_zalloc(0x60);
  t->old = ptVar4;
  term_win_init(ptVar4,w,h);
  ptVar4 = (term_win *)mem_zalloc(0x60);
  t->scr = ptVar4;
  term_win_init(ptVar4,w,h);
  if (L'\0' < h) {
    piVar3 = t->x1;
    piVar1 = t->x2;
    uVar5 = 0;
    do {
      piVar3[uVar5] = 0;
      piVar1[uVar5] = w + L'\xffffffff';
      uVar5 = uVar5 + 1;
    } while ((uint)h != uVar5);
  }
  t->y1 = 0;
  t->y2 = h + L'\xffffffff';
  t->total_erase = true;
  t->saved = '\0';
  t->sidebar_mode = 0;
  return 0;
}

Assistant:

errr term_init(term *t, int w, int h, int k)
{
	int y;

	/* Wipe it */
	memset(t, 0, sizeof(term));

	/* Prepare the input queue */
	t->key_head = t->key_tail = 0;

	/* Determine the input queue size */
	t->key_size = k;

	/* Allocate the input queue */
	t->key_queue = mem_zalloc(t->key_size * sizeof(ui_event));

	/* Save the size */
	t->wid = w;
	t->hgt = h;

	/* Allocate change arrays */
	t->x1 = mem_zalloc(h * sizeof(int));
	t->x2 = mem_zalloc(h * sizeof(int));


	/* Allocate "displayed" */
	t->old = mem_zalloc(sizeof(term_win));

	/* Initialize "displayed" */
	term_win_init(t->old, w, h);


	/* Allocate "requested" */
	t->scr = mem_zalloc(sizeof(term_win));

	/* Initialize "requested" */
	term_win_init(t->scr, w, h);

	/* Assume change */
	for (y = 0; y < h; y++) {
		/* Assume change */
		t->x1[y] = 0;
		t->x2[y] = w - 1;
	}

	/* Assume change */
	t->y1 = 0;
	t->y2 = h - 1;

	/* Force "total erase" */
	t->total_erase = true;

	/* No saves yet */
	t->saved = 0;

	t->sidebar_mode = SIDEBAR_LEFT;

	/* Success */
	return (0);
}